

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void canvas_dopaste(_glist *x,_binbuf *b)

{
  _class **pp_Var1;
  _instanceeditor *p_Var2;
  t_selection *ptVar3;
  _glist *x_00;
  _class **pp_Var4;
  _class **pp_Var5;
  int oldstate;
  t_symbol *ptVar6;
  t_gobj *ptVar7;
  t_symbol *ptVar8;
  t_gotfn p_Var9;
  uint uVar10;
  uint uVar11;
  
  oldstate = canvas_suspend_dsp();
  ptVar6 = gensym("#A");
  pp_Var5 = s__X.s_thing;
  pp_Var4 = s__N.s_thing;
  pp_Var1 = ptVar6->s_thing;
  ptVar6->s_thing = (_class **)0x0;
  s__N.s_thing = &pd_canvasmaker;
  s__X.s_thing = (_class **)x;
  canvas_editmode(x,1.0);
  glist_noselect(x);
  uVar11 = 0;
  for (ptVar7 = x->gl_list; ptVar7 != (t_gobj *)0x0; ptVar7 = ptVar7->g_next) {
    uVar11 = uVar11 + 1;
  }
  p_Var2 = (pd_maininstance.pd_gui)->i_editor;
  *(uint *)(p_Var2 + 0x68) = uVar11;
  *(_glist **)(p_Var2 + 0x70) = x;
  uVar10 = 0;
  binbuf_eval(b,(t_pd *)0x0,0,(t_atom *)0x0);
  for (ptVar7 = x->gl_list; ptVar7 != (t_gobj *)0x0; ptVar7 = ptVar7->g_next) {
    if (uVar11 <= uVar10) {
      glist_select(x,ptVar7);
    }
    uVar10 = uVar10 + 1;
  }
  *(undefined8 *)((pd_maininstance.pd_gui)->i_editor + 0x70) = 0;
  canvas_resume_dsp(oldstate);
  canvas_dirty(x,1.0);
  if ((x->field_0xe8 & 2) != 0) {
    pdgui_vmess("pdtk_canvas_getscroll","c",x);
  }
  if ((sys_noloadbang == 0) && (x->gl_editor != (t_editor *)0x0)) {
    for (ptVar3 = x->gl_editor->e_selection; ptVar3 != (t_selection *)0x0; ptVar3 = ptVar3->sel_next
        ) {
      x_00 = (_glist *)ptVar3->sel_what;
      if ((x_00->gl_obj).te_g.g_pd == canvas_class) {
        canvas_loadbang(x_00);
      }
      else {
        ptVar8 = gensym("loadbang");
        p_Var9 = zgetfn((t_pd *)x_00,ptVar8);
        if (p_Var9 != (t_gotfn)0x0) {
          ptVar7 = ptVar3->sel_what;
          ptVar8 = gensym("loadbang");
          pd_vmess(&ptVar7->g_pd,ptVar8,"f",0);
        }
      }
    }
  }
  ptVar6->s_thing = pp_Var1;
  s__X.s_thing = pp_Var5;
  s__N.s_thing = pp_Var4;
  return;
}

Assistant:

static void canvas_dopaste(t_canvas *x, t_binbuf *b)
{
    t_gobj *g2;
    int dspstate = canvas_suspend_dsp(), nbox, count;
    t_symbol *asym = gensym("#A");
        /* save and clear bindings to symbols #A, #N, #X; restore when done */
    t_pd *boundx = s__X.s_thing, *bounda = asym->s_thing,
        *boundn = s__N.s_thing;
    asym->s_thing = 0;
    s__X.s_thing = &x->gl_pd;
    s__N.s_thing = &pd_canvasmaker;

    canvas_editmode(x, 1.);
    glist_noselect(x);
    for (g2 = x->gl_list, nbox = 0; g2; g2 = g2->g_next) nbox++;

    EDITOR->paste_onset = nbox;
    EDITOR->paste_canvas = x;

    binbuf_eval(b, 0, 0, 0);
    for (g2 = x->gl_list, count = 0; g2; g2 = g2->g_next, count++)
        if (count >= nbox)
            glist_select(x, g2);
    EDITOR->paste_canvas = 0;
    canvas_resume_dsp(dspstate);
    canvas_dirty(x, 1);
    if (x->gl_mapped)
        pdgui_vmess("pdtk_canvas_getscroll", "c", x);
    if (!sys_noloadbang)
        glist_donewloadbangs(x);
    asym->s_thing = bounda;
    s__X.s_thing = boundx;
    s__N.s_thing = boundn;
}